

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase106::run(TestCase106 *this)

{
  WirePointer *pWVar1;
  int iVar2;
  WirePointer *pWVar3;
  int iVar4;
  int iVar5;
  Schema SVar6;
  WirePointer id;
  uint64_t id_00;
  WirePointer id_01;
  Reader RVar7;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StructSchema union1g;
  StructSchema schema;
  Field u1f0s8;
  Field union1;
  Schema local_f0;
  Schema local_e8;
  ArrayPtr<const_char> local_e0;
  WirePointer *local_d0;
  int local_c8;
  uint local_c0;
  Field local_98;
  Field local_58;
  
  local_e0.size_ = (size_t)local_e0.ptr;
  local_e0.ptr = " rc";
  local_e8.raw = (RawBrandedSchema *)Schema::asStruct((Schema *)&local_e0);
  name.content.size_ = 5;
  name.content.ptr = "bit0";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e0,(StructSchema *)&local_e8,name);
  if (((char)local_e0.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x6d,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"bit0\\\") != nullptr\"",
               (char (*) [59])"failed: expected schema.findFieldByName(\"bit0\") != nullptr");
  }
  name_00.content.size_ = 7;
  name_00.content.ptr = "u1f0s8";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e0,(StructSchema *)&local_e8,name_00);
  if (((char)local_e0.ptr == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x6e,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"u1f0s8\\\") == nullptr\"",
               (char (*) [61])"failed: expected schema.findFieldByName(\"u1f0s8\") == nullptr");
  }
  name_01.content.size_ = 7;
  name_01.content.ptr = "union1";
  StructSchema::getFieldByName(&local_58,(StructSchema *)&local_e8,name_01);
  if (local_58.proto._reader.dataSize < 0xc0) {
    id_00 = 0;
  }
  else {
    id_00 = *(uint64_t *)((long)local_58.proto._reader.data + 0x10);
  }
  id.offsetAndKind.value = 0;
  id.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  SVar6 = Schema::getDependency(&local_e8,id_00,0);
  local_e0.ptr = (char *)SVar6.raw;
  local_f0.raw = (RawBrandedSchema *)Schema::asStruct((Schema *)&local_e0);
  Schema::getProto((Reader *)&local_e0,&local_f0);
  if (0xbf < local_c0) {
    id = local_d0[2];
  }
  SVar6 = Schema::getDependency(&local_f0,(uint64_t)id,0);
  if ((local_e8.raw != SVar6.raw) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto((Reader *)&local_e0,&local_f0);
    if (local_c0 < 0xc0) {
      id_01.offsetAndKind.value = 0;
      id_01.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      id_01 = local_d0[2];
    }
    local_98.parent.super_Schema = Schema::getDependency(&local_f0,(uint64_t)id_01,0);
    kj::_::Debug::log<char_const(&)[86],capnp::StructSchema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x72,ERROR,
               "\"failed: expected \" \"(schema) == (union1g.getDependency(union1g.getProto().getScopeId()))\", schema, union1g.getDependency(union1g.getProto().getScopeId())"
               ,(char (*) [86])
                "failed: expected (schema) == (union1g.getDependency(union1g.getProto().getScopeId()))"
               ,(StructSchema *)&local_e8,(Schema *)&local_98);
  }
  name_02.content.size_ = 5;
  name_02.content.ptr = "bin0";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e0,(StructSchema *)&local_f0,name_02);
  if (((char)local_e0.ptr == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x73,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"bin0\\\") == nullptr\"",
               (char (*) [60])"failed: expected union1g.findFieldByName(\"bin0\") == nullptr");
  }
  name_03.content.size_ = 7;
  name_03.content.ptr = "u1f0s8";
  StructSchema::getFieldByName(&local_98,(StructSchema *)&local_f0,name_03);
  local_e0.size_ = (size_t)local_98.proto._reader.capTable;
  local_d0 = local_98.proto._reader.pointers;
  local_e0.ptr = (char *)local_98.proto._reader.segment;
  local_c8 = local_98.proto._reader.nestingLimit;
  if (local_98.proto._reader.pointerCount == 0) {
    local_e0.size_ = (size_t)(CapTableReader *)0x0;
    local_d0 = (WirePointer *)0x0;
    local_e0.ptr = (char *)(SegmentReader *)0x0;
    local_c8 = 0x7fffffff;
  }
  RVar7 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_e0,(void *)0x0,0);
  pWVar1 = local_d0;
  iVar2 = local_c8;
  pWVar3 = local_98.proto._reader.pointers;
  iVar4 = local_98.proto._reader.nestingLimit;
  if (((RVar7.super_StringPtr.content.size_ != 7) ||
      (iVar5 = bcmp(RVar7.super_StringPtr.content.ptr,"u1f0s8",6), pWVar1 = local_d0,
      iVar2 = local_c8, pWVar3 = local_98.proto._reader.pointers,
      iVar4 = local_98.proto._reader.nestingLimit, iVar5 != 0)) &&
     (local_c8 = iVar4, local_d0 = pWVar3, kj::_::Debug::minSeverity < 3)) {
    if (local_98.proto._reader.pointerCount == 0) {
      local_c8 = 0x7fffffff;
      local_98.proto._reader.capTable = (CapTableReader *)0x0;
      local_d0 = (WirePointer *)0x0;
      local_98.proto._reader.segment = (SegmentReader *)0x0;
    }
    local_e0.size_ = (size_t)local_98.proto._reader.capTable;
    local_e0.ptr = (char *)local_98.proto._reader.segment;
    local_e0 = (ArrayPtr<const_char>)
               PointerReader::getBlob<capnp::Text>((PointerReader *)&local_e0,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[61],char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x76,ERROR,
               "\"failed: expected \" \"(\\\"u1f0s8\\\") == (u1f0s8.getProto().getName())\", \"u1f0s8\", u1f0s8.getProto().getName()"
               ,(char (*) [61])"failed: expected (\"u1f0s8\") == (u1f0s8.getProto().getName())",
               (char (*) [7])"u1f0s8",(Reader *)&local_e0);
    pWVar1 = local_d0;
    iVar2 = local_c8;
  }
  local_c8 = iVar2;
  local_d0 = pWVar1;
  if ((local_98.parent.super_Schema.raw != (Schema)local_f0.raw) && (kj::_::Debug::minSeverity < 3))
  {
    kj::_::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x77,ERROR,"\"failed: expected \" \"u1f0s8.getContainingStruct() == union1g\"",
               (char (*) [57])"failed: expected u1f0s8.getContainingStruct() == union1g");
  }
  name_04.content.size_ = 7;
  name_04.content.ptr = "u1f1s8";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e0,(StructSchema *)&local_f0,name_04);
  if (((char)local_e0.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x79,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s8\\\") != nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u1f1s8\") != nullptr");
  }
  name_05.content.size_ = 8;
  name_05.content.ptr = "u1f0s32";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e0,(StructSchema *)&local_f0,name_05);
  if (((char)local_e0.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[63]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7a,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0s32\\\") != nullptr\"",
               (char (*) [63])"failed: expected union1g.findFieldByName(\"u1f0s32\") != nullptr");
  }
  name_06.content.size_ = 7;
  name_06.content.ptr = "u1f0sp";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e0,(StructSchema *)&local_f0,name_06);
  if (((char)local_e0.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7b,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0sp\\\") != nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u1f0sp\") != nullptr");
  }
  name_07.content.size_ = 7;
  name_07.content.ptr = "u1f1s1";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e0,(StructSchema *)&local_f0,name_07);
  if (((char)local_e0.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7c,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s1\\\") != nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u1f1s1\") != nullptr");
  }
  name_08.content.size_ = 7;
  name_08.content.ptr = "u0f0s1";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e0,(StructSchema *)&local_f0,name_08);
  if (((char)local_e0.ptr == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7e,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u0f0s1\\\") == nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u0f0s1\") == nullptr");
  }
  name_09.content.size_ = 7;
  name_09.content.ptr = "u2f0s8";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e0,(StructSchema *)&local_f0,name_09);
  if (((char)local_e0.ptr == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7f,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u2f0s8\\\") == nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u2f0s8\") == nullptr");
  }
  name_10.content.size_ = 0xc;
  name_10.content.ptr = "noSuchField";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e0,(StructSchema *)&local_f0,name_10);
  if (((char)local_e0.ptr == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[67]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x80,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"noSuchField\\\") == nullptr\"",
               (char (*) [67])"failed: expected union1g.findFieldByName(\"noSuchField\") == nullptr"
              );
  }
  return;
}

Assistant:

TEST(Schema, Unions) {
  auto schema = Schema::from<TestUnion>().asStruct();

  EXPECT_TRUE(schema.findFieldByName("bit0") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("u1f0s8") == nullptr);

  auto union1 = schema.getFieldByName("union1");
  auto union1g = schema.getDependency(union1.getProto().getGroup().getTypeId()).asStruct();
  EXPECT_EQ(schema, union1g.getDependency(union1g.getProto().getScopeId()));
  EXPECT_TRUE(union1g.findFieldByName("bin0") == nullptr);

  auto u1f0s8 = union1g.getFieldByName("u1f0s8");
  EXPECT_EQ("u1f0s8", u1f0s8.getProto().getName());
  EXPECT_TRUE(u1f0s8.getContainingStruct() == union1g);

  EXPECT_TRUE(union1g.findFieldByName("u1f1s8") != nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u1f0s32") != nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u1f0sp") != nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u1f1s1") != nullptr);

  EXPECT_TRUE(union1g.findFieldByName("u0f0s1") == nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u2f0s8") == nullptr);
  EXPECT_TRUE(union1g.findFieldByName("noSuchField") == nullptr);
}